

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O1

Aig_Man_t * Saig_ManUnrollCOI(Aig_Man_t *pAig,int nFrames)

{
  int iVar1;
  char *pcVar2;
  void *pvVar3;
  long lVar4;
  Aig_Obj_t **ppAVar5;
  Aig_Man_t *p;
  char *pcVar6;
  Aig_Obj_t *pAVar7;
  Vec_Ptr_t *pVVar8;
  ulong uVar9;
  ulong uVar10;
  Aig_Obj_t *p1;
  int iVar11;
  int iVar12;
  uint uVar13;
  size_t sVar14;
  ulong uVar15;
  long lVar16;
  
  lVar4 = (long)nFrames;
  sVar14 = pAig->vObjs->nSize * lVar4;
  ppAVar5 = (Aig_Obj_t **)calloc(sVar14,8);
  p = Aig_ManStart((int)sVar14);
  pcVar2 = pAig->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar14 = strlen(pcVar2);
    pcVar6 = (char *)malloc(sVar14 + 1);
    strcpy(pcVar6,pcVar2);
  }
  p->pName = pcVar6;
  pcVar2 = pAig->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar14 = strlen(pcVar2);
    pcVar6 = (char *)malloc(sVar14 + 1);
    strcpy(pcVar6,pcVar2);
  }
  p->pSpec = pcVar6;
  if (0 < nFrames) {
    iVar12 = pAig->pConst1->Id;
    uVar10 = 0;
    do {
      ppAVar5[iVar12 * lVar4 + uVar10] = p->pConst1;
      uVar10 = uVar10 + 1;
    } while ((uint)nFrames != uVar10);
  }
  if (0 < nFrames) {
    iVar12 = 0;
    do {
      if (pAig->nRegs < pAig->nObjs[2]) {
        lVar16 = 0;
        do {
          if (pAig->vCis->nSize <= lVar16) goto LAB_0064ad07;
          pvVar3 = pAig->vCis->pArray[lVar16];
          pAVar7 = Aig_ObjCreateCi(p);
          ppAVar5[*(int *)((long)pvVar3 + 0x24) * nFrames + iVar12] = pAVar7;
          lVar16 = lVar16 + 1;
        } while (lVar16 < (long)pAig->nObjs[2] - (long)pAig->nRegs);
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 != nFrames);
  }
  uVar13 = pAig->nObjs[2] - pAig->nRegs;
  pVVar8 = pAig->vCis;
  if ((int)uVar13 < pVVar8->nSize) {
    uVar10 = (ulong)uVar13;
    do {
      if ((int)uVar13 < 0) goto LAB_0064ad07;
      pvVar3 = pVVar8->pArray[uVar10];
      pAVar7 = Aig_ObjCreateCi(p);
      ppAVar5[*(int *)((long)pvVar3 + 0x24) * lVar4] = pAVar7;
      uVar10 = uVar10 + 1;
      pVVar8 = pAig->vCis;
    } while ((int)uVar10 < pVVar8->nSize);
  }
  if (0 < nFrames) {
    iVar12 = 0;
    do {
      pVVar8 = pAig->vObjs;
      if (0 < pVVar8->nSize) {
        lVar4 = 0;
        do {
          pvVar3 = pVVar8->pArray[lVar4];
          if ((pvVar3 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar3 + 0x18) & 7) - 7)) {
            uVar10 = *(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe;
            if (uVar10 == 0) {
              pAVar7 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar7 = (Aig_Obj_t *)
                       ((ulong)((uint)*(ulong *)((long)pvVar3 + 8) & 1) ^
                       (ulong)ppAVar5[*(int *)(uVar10 + 0x24) * nFrames + iVar12]);
            }
            uVar10 = *(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe;
            if (uVar10 == 0) {
              p1 = (Aig_Obj_t *)0x0;
            }
            else {
              p1 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar3 + 0x10) & 1) ^
                   (ulong)ppAVar5[*(int *)(uVar10 + 0x24) * nFrames + iVar12]);
            }
            pAVar7 = Aig_And(p,pAVar7,p1);
            ppAVar5[*(int *)((long)pvVar3 + 0x24) * nFrames + iVar12] = pAVar7;
          }
          lVar4 = lVar4 + 1;
          pVVar8 = pAig->vObjs;
        } while (lVar4 < pVVar8->nSize);
      }
      iVar11 = pAig->nRegs;
      lVar4 = (long)iVar11;
      if (0 < lVar4) {
        pVVar8 = pAig->vCos;
        iVar1 = pAig->nObjs[3];
        uVar10 = (ulong)(uint)(iVar1 - iVar11);
        iVar11 = -iVar11;
        do {
          if (((((int)uVar10 < 0) || (pVVar8->nSize <= iVar1 + iVar11)) ||
              (uVar13 = pAig->nObjs[2] + iVar11, (int)uVar13 < 0)) ||
             (pAig->vCis->nSize <= (int)uVar13)) goto LAB_0064ad07;
          uVar9 = *(ulong *)((long)pVVar8->pArray[uVar10] + 8);
          uVar15 = uVar9 & 0xfffffffffffffffe;
          if (uVar15 == 0) {
            pAVar7 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar7 = (Aig_Obj_t *)
                     ((ulong)((uint)uVar9 & 1) ^
                     (ulong)ppAVar5[*(int *)(uVar15 + 0x24) * nFrames + iVar12]);
          }
          if (iVar12 < nFrames + -1) {
            ppAVar5[*(int *)((long)pAig->vCis->pArray[uVar13] + 0x24) * nFrames + iVar12 + 1] =
                 pAVar7;
          }
          uVar10 = uVar10 + 1;
          iVar11 = iVar11 + 1;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 != nFrames);
  }
  if (pAig->nRegs < pAig->nObjs[3]) {
    lVar4 = 0;
    do {
      if (pAig->vCos->nSize <= lVar4) {
LAB_0064ad07:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar3 = pAig->vCos->pArray[lVar4];
      uVar10 = *(ulong *)((long)pvVar3 + 8);
      uVar9 = uVar10 & 0xfffffffffffffffe;
      if (uVar9 == 0) {
        pAVar7 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar7 = (Aig_Obj_t *)
                 ((ulong)((uint)uVar10 & 1) ^
                 (ulong)ppAVar5[*(int *)(uVar9 + 0x24) * nFrames + nFrames + -1]);
      }
      pAVar7 = Aig_ObjCreateCo(p,pAVar7);
      ppAVar5[*(int *)((long)pvVar3 + 0x24) * nFrames + nFrames + -1] = pAVar7;
      lVar4 = lVar4 + 1;
    } while (lVar4 < (long)pAig->nObjs[3] - (long)pAig->nRegs);
  }
  if (pAig->pObjCopies == (Aig_Obj_t **)0x0) {
    pAig->pObjCopies = ppAVar5;
    return p;
  }
  __assert_fail("pAig->pObjCopies == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigConstr2.c"
                ,0x1e0,"Aig_Man_t *Saig_ManUnrollCOI(Aig_Man_t *, int)");
}

Assistant:

Aig_Man_t * Saig_ManUnrollCOI( Aig_Man_t * pAig, int nFrames )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pObjNew;
    Aig_Obj_t ** pObjMap;
    int i, f;
    // create mapping for the frames nodes
    pObjMap = ABC_CALLOC( Aig_Obj_t *, nFrames * Aig_ManObjNumMax(pAig) );
    // start the fraig package
    pFrames = Aig_ManStart( Aig_ManObjNumMax(pAig) * nFrames );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    pFrames->pSpec = Abc_UtilStrsav( pAig->pSpec );
    // map constant nodes
    for ( f = 0; f < nFrames; f++ )
        Aig_ObjSetFrames( pObjMap, nFrames, Aig_ManConst1(pAig), f, Aig_ManConst1(pFrames) );
    // create PI nodes for the frames
    for ( f = 0; f < nFrames; f++ )
        Aig_ManForEachPiSeq( pAig, pObj, i )
            Aig_ObjSetFrames( pObjMap, nFrames, pObj, f, Aig_ObjCreateCi(pFrames) );
    // set initial state for the latches
    Aig_ManForEachLoSeq( pAig, pObj, i )
        Aig_ObjSetFrames( pObjMap, nFrames, pObj, 0, Aig_ObjCreateCi(pFrames) );
    // add timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        Aig_ManForEachNode( pAig, pObj, i )
        {
            pObjNew = Aig_And( pFrames, Aig_ObjChild0Frames(pObjMap,nFrames,pObj,f), Aig_ObjChild1Frames(pObjMap,nFrames,pObj,f) );
            Aig_ObjSetFrames( pObjMap, nFrames, pObj, f, pObjNew );
        }
        // set the latch inputs and copy them into the latch outputs of the next frame
        Aig_ManForEachLiLoSeq( pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Aig_ObjChild0Frames(pObjMap,nFrames,pObjLi,f);
            if ( f < nFrames - 1 )
                Aig_ObjSetFrames( pObjMap, nFrames, pObjLo, f+1, pObjNew );
        }
    }
    // create the only output
    for ( f = nFrames-1; f < nFrames; f++ )
    {
        Aig_ManForEachPoSeq( pAig, pObj, i )
        {
            pObjNew = Aig_ObjCreateCo( pFrames, Aig_ObjChild0Frames(pObjMap,nFrames,pObj,f) );
            Aig_ObjSetFrames( pObjMap, nFrames, pObj, f, pObjNew );
        }
    }
    // created lots of dangling nodes - no sweeping!
    //Aig_ManCleanup( pFrames );
    assert( pAig->pObjCopies == NULL );
    pAig->pObjCopies = pObjMap;
    return pFrames;
}